

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_dcread(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  TCGv_i64 val;
  uintptr_t o;
  uintptr_t o_1;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_access_type(ctx,0x60);
    EA = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    val = tcg_temp_new_i64(tcg_ctx);
    gen_qemu_ld32u(ctx,val,EA);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    tcg_gen_mov_i64_ppc64
              (tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),EA);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    return;
  }
  gen_priv_exception(ctx,1);
  return;
}

Assistant:

static void gen_dcread(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA, val;

    CHK_SV;
    gen_set_access_type(ctx, ACCESS_CACHE);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    val = tcg_temp_new(tcg_ctx);
    gen_qemu_ld32u(ctx, val, EA);
    tcg_temp_free(tcg_ctx, val);
    tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], EA);
    tcg_temp_free(tcg_ctx, EA);
}